

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress_sequences.c
# Opt level: O3

size_t ZSTD_encodeSequences
                 (void *dst,size_t dstCapacity,FSE_CTable *CTable_MatchLength,BYTE *mlCodeTable,
                 FSE_CTable *CTable_OffsetBits,BYTE *ofCodeTable,FSE_CTable *CTable_LitLength,
                 BYTE *llCodeTable,seqDef *sequences,size_t nbSeq,int longOffsets,int bmi2)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  int iVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong *puVar10;
  size_t sVar11;
  int iVar12;
  long lVar13;
  long lVar14;
  ulong *puVar15;
  ulong *puVar16;
  ulong uVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  ulong uVar22;
  uint uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong *puVar26;
  ulong uVar27;
  ulong local_98;
  ulong local_90;
  
  if (dstCapacity < 9) {
    return 0xffffffffffffffba;
  }
  uVar2 = (ushort)*CTable_MatchLength;
  uVar24 = (ulong)mlCodeTable[nbSeq - 1];
  lVar7 = (long)(1 << ((char)uVar2 - 1U & 0x1f));
  if (uVar2 == 0) {
    lVar7 = 1;
  }
  uVar23 = CTable_MatchLength[lVar7 + uVar24 * 2 + 2] + 0x8000;
  uVar3 = (ushort)*CTable_OffsetBits;
  bVar1 = ofCodeTable[nbSeq - 1];
  uVar8 = (ulong)bVar1;
  lVar13 = (long)(1 << ((char)uVar3 - 1U & 0x1f));
  if (uVar3 == 0) {
    lVar13 = 1;
  }
  uVar21 = CTable_OffsetBits[lVar13 + uVar8 * 2 + 2] + 0x8000;
  uVar4 = *(ushort *)
           ((long)CTable_MatchLength +
           (long)(int)CTable_MatchLength[lVar7 + uVar24 * 2 + 1] * 2 +
           (ulong)((uVar23 & 0xffff0000) - CTable_MatchLength[lVar7 + uVar24 * 2 + 2] >>
                  ((byte)(uVar23 >> 0x10) & 0x3f)) * 2 + 4);
  local_90 = (ulong)*(ushort *)
                     ((long)CTable_OffsetBits +
                     (long)(int)CTable_OffsetBits[lVar13 + uVar8 * 2 + 1] * 2 +
                     (ulong)((uVar21 & 0xffff0000) - CTable_OffsetBits[lVar13 + uVar8 * 2 + 2] >>
                            ((byte)(uVar21 >> 0x10) & 0x3f)) * 2 + 4);
  uVar5 = (ushort)*CTable_LitLength;
  lVar14 = (long)(1 << ((char)uVar5 - 1U & 0x1f));
  if (uVar5 == 0) {
    lVar14 = 1;
  }
  uVar27 = (ulong)llCodeTable[nbSeq - 1];
  uVar23 = CTable_LitLength[lVar14 + uVar27 * 2 + 2] + 0x8000;
  local_98 = (ulong)*(ushort *)
                     ((long)CTable_LitLength +
                     (long)(int)CTable_LitLength[lVar14 + uVar27 * 2 + 1] * 2 +
                     (ulong)((uVar23 & 0xffff0000) - CTable_LitLength[lVar14 + uVar27 * 2 + 2] >>
                            ((byte)(uVar23 >> 0x10) & 0x3f)) * 2 + 4);
  uVar23 = LL_bits[uVar27];
  uVar27 = (ulong)((uint)sequences[nbSeq - 1].matchLength & BIT_mask[ML_bits[uVar24]]) <<
           ((byte)uVar23 & 0x3f) | (ulong)((uint)sequences[nbSeq - 1].litLength & BIT_mask[uVar23]);
  uVar23 = ML_bits[uVar24] + uVar23;
  puVar15 = (ulong *)((long)dst + (dstCapacity - 8));
  puVar10 = (ulong *)dst;
  if (longOffsets == 0) {
    uVar27 = (ulong)(BIT_mask[uVar8] & sequences[nbSeq - 1].offset) << ((byte)uVar23 & 0x3f) |
             uVar27;
    uVar23 = uVar23 + bVar1;
    goto LAB_001bc16f;
  }
  if (bVar1 < 0x38) {
    uVar21 = sequences[nbSeq - 1].offset;
LAB_001bc10d:
    uVar24 = 0;
  }
  else {
    uVar21 = sequences[nbSeq - 1].offset;
    if (bVar1 == 0x38) {
      uVar8 = 0x38;
      goto LAB_001bc10d;
    }
    uVar24 = (ulong)(bVar1 - 0x38);
    uVar27 = (ulong)(BIT_mask[uVar24] & uVar21) << ((byte)uVar23 & 0x3f) | uVar27;
    uVar23 = (uVar23 + bVar1) - 0x38;
    puVar10 = (ulong *)((ulong)(uVar23 >> 3) + (long)dst);
    if (puVar15 < puVar10) {
      puVar10 = puVar15;
    }
    *(ulong *)dst = uVar27;
    uVar27 = uVar27 >> ((byte)uVar23 & 0x38);
    uVar23 = uVar23 & 7;
    uVar8 = 0x38;
  }
  uVar27 = (ulong)(uVar21 >> ((byte)uVar24 & 0x1f) & BIT_mask[uVar8]) << ((byte)uVar23 & 0x3f) |
           uVar27;
  uVar23 = uVar23 + (int)uVar8;
LAB_001bc16f:
  puVar26 = (ulong *)((ulong)(uVar23 >> 3) + (long)puVar10);
  if (puVar15 < puVar26) {
    puVar26 = puVar15;
  }
  *puVar10 = uVar27;
  uVar27 = uVar27 >> ((byte)uVar23 & 0x38);
  uVar23 = uVar23 & 7;
  if (1 < nbSeq) {
    uVar24 = nbSeq - 2;
    do {
      uVar19 = (ulong)llCodeTable[uVar24];
      bVar1 = ofCodeTable[uVar24];
      uVar17 = (ulong)bVar1;
      uVar25 = (ulong)mlCodeTable[uVar24];
      uVar8 = CTable_OffsetBits[lVar13 + uVar17 * 2 + 2] + local_90;
      uVar21 = (uint)local_90;
      iVar6 = (int)(uVar8 >> 0x10) + uVar23;
      local_90 = (ulong)*(ushort *)
                         ((long)CTable_OffsetBits +
                         (long)(int)CTable_OffsetBits[lVar13 + uVar17 * 2 + 1] * 2 +
                         (local_90 >> ((byte)(uVar8 >> 0x10) & 0x3f)) * 2 + 4);
      uVar22 = (ulong)CTable_MatchLength[lVar7 + uVar25 * 2 + 2] + (ulong)uVar4;
      uVar18 = (uint)uVar4;
      iVar12 = (int)(uVar22 >> 0x10) + iVar6;
      uVar9 = CTable_LitLength[lVar14 + uVar19 * 2 + 2] + local_98;
      uVar4 = *(ushort *)
               ((long)CTable_MatchLength +
               (long)(int)CTable_MatchLength[lVar7 + uVar25 * 2 + 1] * 2 +
               (ulong)(uVar4 >> ((byte)(uVar22 >> 0x10) & 0x3f)) * 2 + 4);
      uVar27 = (ulong)(BIT_mask[uVar9 >> 0x10] & (uint)local_98) << ((byte)iVar12 & 0x3f) |
               (ulong)(BIT_mask[uVar22 >> 0x10] & uVar18) << ((byte)iVar6 & 0x3f) |
               (ulong)(BIT_mask[uVar8 >> 0x10] & uVar21) << (sbyte)uVar23 | uVar27;
      uVar21 = LL_bits[uVar19];
      uVar23 = ML_bits[uVar25];
      uVar20 = (int)(uVar9 >> 0x10) + iVar12;
      local_98 = (ulong)*(ushort *)
                         ((long)CTable_LitLength +
                         (long)(int)CTable_LitLength[lVar14 + uVar19 * 2 + 1] * 2 +
                         (local_98 >> ((byte)(uVar9 >> 0x10) & 0x3f)) * 2 + 4);
      uVar18 = uVar23 + uVar21 + bVar1;
      puVar10 = puVar26;
      if (0x1e < uVar18) {
        puVar10 = (ulong *)((ulong)(uVar20 >> 3) + (long)puVar26);
        if (puVar15 < puVar10) {
          puVar10 = puVar15;
        }
        *puVar26 = uVar27;
        uVar27 = uVar27 >> ((byte)uVar20 & 0x38);
        uVar20 = uVar20 & 7;
      }
      uVar27 = (ulong)((uint)sequences[uVar24].matchLength & BIT_mask[uVar23]) <<
               ((byte)(uVar21 + uVar20) & 0x3f) |
               (ulong)((uint)sequences[uVar24].litLength & BIT_mask[uVar21]) <<
               ((byte)uVar20 & 0x3f) | uVar27;
      uVar23 = uVar23 + uVar21 + uVar20;
      puVar16 = puVar10;
      if (0x38 < uVar18) {
        puVar16 = (ulong *)((ulong)(uVar23 >> 3) + (long)puVar10);
        if (puVar15 < puVar16) {
          puVar16 = puVar15;
        }
        *puVar10 = uVar27;
        uVar27 = uVar27 >> ((byte)uVar23 & 0x38);
        uVar23 = uVar23 & 7;
      }
      if (longOffsets == 0) {
        uVar27 = (ulong)(BIT_mask[uVar17] & sequences[uVar24].offset) << ((byte)uVar23 & 0x3f) |
                 uVar27;
        uVar23 = uVar23 + bVar1;
      }
      else {
        puVar10 = puVar16;
        if (bVar1 < 0x38) {
          uVar21 = sequences[uVar24].offset;
          uVar8 = 0;
        }
        else {
          uVar8 = 0;
          uVar21 = sequences[uVar24].offset;
          if (bVar1 == 0x38) {
            uVar17 = 0x38;
          }
          else {
            uVar8 = (ulong)(bVar1 - 0x38);
            uVar27 = (ulong)(BIT_mask[uVar8] & uVar21) << ((byte)uVar23 & 0x3f) | uVar27;
            uVar23 = (uVar23 + bVar1) - 0x38;
            puVar10 = (ulong *)((ulong)(uVar23 >> 3) + (long)puVar16);
            if (puVar15 < puVar10) {
              puVar10 = puVar15;
            }
            *puVar16 = uVar27;
            uVar27 = uVar27 >> ((byte)uVar23 & 0x38);
            uVar23 = uVar23 & 7;
            uVar17 = 0x38;
          }
        }
        uVar27 = (ulong)(uVar21 >> ((byte)uVar8 & 0x1f) & BIT_mask[uVar17]) << ((byte)uVar23 & 0x3f)
                 | uVar27;
        uVar23 = uVar23 + (int)uVar17;
        puVar16 = puVar10;
      }
      puVar26 = (ulong *)((ulong)(uVar23 >> 3) + (long)puVar16);
      if (puVar15 < puVar26) {
        puVar26 = puVar15;
      }
      *puVar16 = uVar27;
      uVar27 = uVar27 >> ((byte)uVar23 & 0x38);
      uVar24 = uVar24 - 1;
      uVar23 = uVar23 & 7;
    } while (uVar24 < nbSeq);
  }
  uVar27 = (ulong)((uint)uVar4 & BIT_mask[uVar2]) << (sbyte)uVar23 | uVar27;
  uVar23 = uVar23 + uVar2;
  puVar10 = (ulong *)((ulong)(uVar23 >> 3) + (long)puVar26);
  if (puVar15 < puVar10) {
    puVar10 = puVar15;
  }
  *puVar26 = uVar27;
  uVar24 = (ulong)((uint)local_90 & BIT_mask[uVar3]) << (sbyte)(uVar23 & 7) |
           uVar27 >> ((byte)uVar23 & 0x38);
  uVar23 = (uVar23 & 7) + (uint)uVar3;
  puVar26 = (ulong *)((ulong)(uVar23 >> 3) + (long)puVar10);
  if (puVar15 < puVar26) {
    puVar26 = puVar15;
  }
  *puVar10 = uVar24;
  uVar24 = (ulong)((uint)local_98 & BIT_mask[uVar5]) << (sbyte)(uVar23 & 7) |
           uVar24 >> ((byte)uVar23 & 0x38);
  uVar23 = (uVar23 & 7) + (uint)uVar5;
  puVar10 = (ulong *)((ulong)(uVar23 >> 3) + (long)puVar26);
  if (puVar15 < puVar10) {
    puVar10 = puVar15;
  }
  *puVar26 = uVar24;
  uVar21 = (uVar23 & 7) + 1;
  *puVar10 = uVar24 >> ((byte)uVar23 & 0x38) | 1L << (uVar23 & 7);
  puVar10 = (ulong *)((ulong)(uVar21 >> 3) + (long)puVar10);
  if (puVar15 < puVar10) {
    puVar10 = puVar15;
  }
  if ((puVar15 <= puVar10) ||
     (sVar11 = (long)puVar10 + ((ulong)((uVar21 & 7) != 0) - (long)dst), sVar11 == 0)) {
    sVar11 = 0xffffffffffffffba;
  }
  return sVar11;
}

Assistant:

size_t ZSTD_encodeSequences(
            void* dst, size_t dstCapacity,
            FSE_CTable const* CTable_MatchLength, BYTE const* mlCodeTable,
            FSE_CTable const* CTable_OffsetBits, BYTE const* ofCodeTable,
            FSE_CTable const* CTable_LitLength, BYTE const* llCodeTable,
            seqDef const* sequences, size_t nbSeq, int longOffsets, int bmi2)
{
    DEBUGLOG(5, "ZSTD_encodeSequences: dstCapacity = %u", (unsigned)dstCapacity);
#if DYNAMIC_BMI2
    if (bmi2) {
        return ZSTD_encodeSequences_bmi2(dst, dstCapacity,
                                         CTable_MatchLength, mlCodeTable,
                                         CTable_OffsetBits, ofCodeTable,
                                         CTable_LitLength, llCodeTable,
                                         sequences, nbSeq, longOffsets);
    }
#endif
    (void)bmi2;
    return ZSTD_encodeSequences_default(dst, dstCapacity,
                                        CTable_MatchLength, mlCodeTable,
                                        CTable_OffsetBits, ofCodeTable,
                                        CTable_LitLength, llCodeTable,
                                        sequences, nbSeq, longOffsets);
}